

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::String::Find(String *this,char *b,int pos)

{
  int local_2c;
  int local_28;
  int j;
  int i;
  int pos_local;
  char *b_local;
  String *this_local;
  
  if (b == (char *)0x0) {
    this_local._4_4_ = -1;
  }
  else if ((uint)(this->super_tagbstring).slen < (uint)pos) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = pos;
    if (*b != '\0') {
      if (pos == (this->super_tagbstring).slen) {
        this_local._4_4_ = -1;
      }
      else {
        local_2c = 0;
        local_28 = pos;
        do {
          while( true ) {
            if ((this->super_tagbstring).slen <= local_28 + local_2c) {
              return -1;
            }
            if (b[local_2c] == (this->super_tagbstring).data[local_28 + local_2c]) break;
            local_28 = local_28 + 1;
            local_2c = 0;
          }
          local_2c = local_2c + 1;
        } while (b[local_2c] != '\0');
        this_local._4_4_ = local_28;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int String::Find(const char * b, int pos) const
    {
        int i, j;

        if (NULL == b) return BSTR_ERR;

        if ((unsigned int) pos > (unsigned int) slen)
            return BSTR_ERR;
        if ('\0' == b[0])            return pos;
        if (pos == slen)            return BSTR_ERR;

        i = pos;
        j = 0;

        for (; i + j < slen; )
        {
            if ((unsigned char) b[j] == data[i + j])
            {
                j++;
                if ('\0' == b[j])    return i;
                continue;
            }
            i++;
            j = 0;
        }

        return BSTR_ERR;
    }